

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_tagged_sha256
              (secp256k1_context *ctx,uchar *hash32,uchar *tag,size_t taglen,uchar *msg,
              size_t msglen)

{
  long in_RDX;
  long in_RSI;
  long in_R8;
  secp256k1_sha256 sha;
  char *in_stack_ffffffffffffff58;
  secp256k1_callback *in_stack_ffffffffffffff60;
  uchar *in_stack_ffffffffffffff68;
  secp256k1_sha256 *in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  secp256k1_sha256 *in_stack_ffffffffffffff80;
  undefined4 local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_4 = 0;
  }
  else {
    secp256k1_sha256_initialize_tagged
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70
              );
    secp256k1_sha256_write
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60
              );
    secp256k1_sha256_finalize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    secp256k1_sha256_clear((secp256k1_sha256 *)0x1054e1);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_tagged_sha256(const secp256k1_context* ctx, unsigned char *hash32, const unsigned char *tag, size_t taglen, const unsigned char *msg, size_t msglen) {
    secp256k1_sha256 sha;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(hash32 != NULL);
    ARG_CHECK(tag != NULL);
    ARG_CHECK(msg != NULL);

    secp256k1_sha256_initialize_tagged(&sha, tag, taglen);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, hash32);
    secp256k1_sha256_clear(&sha);
    return 1;
}